

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_uniform_block_active_visitor.cpp
# Opt level: O3

ir_visitor_status __thiscall
link_uniform_block_active_visitor::visit
          (link_uniform_block_active_visitor *this,ir_dereference_variable *ir)

{
  ir_variable *var;
  link_uniform_block_active *plVar1;
  glsl_type *t;
  glsl_type *pgVar2;
  ir_visitor_status iVar3;
  
  var = ir->var;
  iVar3 = visit_continue;
  if (var->interface_type != (glsl_type *)0x0 && (*(uint *)&var->data >> 0xc & 0xf) - 1 < 2) {
    pgVar2 = var->type;
    if (pgVar2->field_0x4 == '\x11') {
      do {
        pgVar2 = (pgVar2->fields).array;
      } while (pgVar2->field_0x4 == '\x11');
      if (pgVar2 == var->interface_type) {
        __assert_fail("!var->is_interface_instance() || !var->type->is_array()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_block_active_visitor.cpp"
                      ,0x115,
                      "virtual ir_visitor_status link_uniform_block_active_visitor::visit(ir_dereference_variable *)"
                     );
      }
    }
    plVar1 = process_block(this->mem_ctx,this->ht,var);
    if (plVar1 == (link_uniform_block_active *)0x0) {
      linker_error(this->prog,"uniform block `%s\' has mismatching definitions",
                   var->interface_type->name);
      (this->super_ir_hierarchical_visitor).field_0x31 = 0;
      iVar3 = visit_stop;
    }
    else {
      if (plVar1->array != (uniform_block_array_elements *)0x0) {
        __assert_fail("b->array == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_block_active_visitor.cpp"
                      ,0x122,
                      "virtual ir_visitor_status link_uniform_block_active_visitor::visit(ir_dereference_variable *)"
                     );
      }
      iVar3 = visit_continue;
      if (plVar1->type == (glsl_type *)0x0) {
        __assert_fail("b->type != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_block_active_visitor.cpp"
                      ,0x123,
                      "virtual ir_visitor_status link_uniform_block_active_visitor::visit(ir_dereference_variable *)"
                     );
      }
    }
  }
  return iVar3;
}

Assistant:

ir_visitor_status
link_uniform_block_active_visitor::visit(ir_dereference_variable *ir)
{
   ir_variable *var = ir->var;

   if (!var->is_in_buffer_block())
      return visit_continue;

   assert(!var->is_interface_instance() || !var->type->is_array());

   /* Process the block.  Bail if there was an error. */
   link_uniform_block_active *const b =
      process_block(this->mem_ctx, this->ht, var);
   if (b == NULL) {
      linker_error(this->prog,
                   "uniform block `%s' has mismatching definitions",
                   var->get_interface_type()->name);
      this->success = false;
      return visit_stop;
   }

   assert(b->array == NULL);
   assert(b->type != NULL);

   return visit_continue;
}